

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btGeneric6DofSpring2Constraint.cpp
# Opt level: O2

void __thiscall
btGeneric6DofSpring2Constraint::btGeneric6DofSpring2Constraint
          (btGeneric6DofSpring2Constraint *this,btRigidBody *rbB,btTransform *frameInB,
          RotateOrder rotOrder)

{
  undefined8 uVar1;
  btRigidBody *rbA;
  long lVar2;
  btTransform local_68;
  
  rbA = btTypedConstraint::getFixedBody();
  btTypedConstraint::btTypedConstraint
            (&this->super_btTypedConstraint,D6_SPRING_2_CONSTRAINT_TYPE,rbA,rbB);
  (this->super_btTypedConstraint)._vptr_btTypedConstraint =
       (_func_int **)&PTR__btTypedConstraint_001f1280;
  uVar1 = *(undefined8 *)((frameInB->m_basis).m_el[0].m_floats + 2);
  *(undefined8 *)(this->m_frameInB).m_basis.m_el[0].m_floats =
       *(undefined8 *)(frameInB->m_basis).m_el[0].m_floats;
  *(undefined8 *)((this->m_frameInB).m_basis.m_el[0].m_floats + 2) = uVar1;
  uVar1 = *(undefined8 *)((frameInB->m_basis).m_el[1].m_floats + 2);
  *(undefined8 *)(this->m_frameInB).m_basis.m_el[1].m_floats =
       *(undefined8 *)(frameInB->m_basis).m_el[1].m_floats;
  *(undefined8 *)((this->m_frameInB).m_basis.m_el[1].m_floats + 2) = uVar1;
  uVar1 = *(undefined8 *)((frameInB->m_basis).m_el[2].m_floats + 2);
  *(undefined8 *)(this->m_frameInB).m_basis.m_el[2].m_floats =
       *(undefined8 *)(frameInB->m_basis).m_el[2].m_floats;
  *(undefined8 *)((this->m_frameInB).m_basis.m_el[2].m_floats + 2) = uVar1;
  uVar1 = *(undefined8 *)((frameInB->m_origin).m_floats + 2);
  *(undefined8 *)(this->m_frameInB).m_origin.m_floats = *(undefined8 *)(frameInB->m_origin).m_floats
  ;
  *(undefined8 *)((this->m_frameInB).m_origin.m_floats + 2) = uVar1;
  btTranslationalLimitMotor2::btTranslationalLimitMotor2(&this->m_linearLimits);
  lVar2 = 0x3e0;
  do {
    btRotationalLimitMotor2::btRotationalLimitMotor2
              ((btRotationalLimitMotor2 *)
               ((long)(this->m_frameInA).m_basis.m_el[0].m_floats + lVar2 + -0x48));
    lVar2 = lVar2 + 0x58;
  } while (lVar2 != 0x4e8);
  this->m_rotateOrder = rotOrder;
  this->m_flags = 0;
  btTransform::operator*
            (&local_68,&(rbB->super_btCollisionObject).m_worldTransform,&this->m_frameInB);
  *(undefined8 *)(this->m_frameInA).m_basis.m_el[0].m_floats =
       local_68.m_basis.m_el[0].m_floats._0_8_;
  *(undefined8 *)((this->m_frameInA).m_basis.m_el[0].m_floats + 2) =
       local_68.m_basis.m_el[0].m_floats._8_8_;
  *(undefined8 *)(this->m_frameInA).m_basis.m_el[1].m_floats =
       local_68.m_basis.m_el[1].m_floats._0_8_;
  *(undefined8 *)((this->m_frameInA).m_basis.m_el[1].m_floats + 2) =
       local_68.m_basis.m_el[1].m_floats._8_8_;
  *(undefined8 *)(this->m_frameInA).m_basis.m_el[2].m_floats =
       local_68.m_basis.m_el[2].m_floats._0_8_;
  *(undefined8 *)((this->m_frameInA).m_basis.m_el[2].m_floats + 2) =
       local_68.m_basis.m_el[2].m_floats._8_8_;
  *(undefined8 *)(this->m_frameInA).m_origin.m_floats = local_68.m_origin.m_floats._0_8_;
  *(undefined8 *)((this->m_frameInA).m_origin.m_floats + 2) = local_68.m_origin.m_floats._8_8_;
  calculateTransforms(this);
  return;
}

Assistant:

btGeneric6DofSpring2Constraint::btGeneric6DofSpring2Constraint(btRigidBody& rbB, const btTransform& frameInB, RotateOrder rotOrder)
	: btTypedConstraint(D6_SPRING_2_CONSTRAINT_TYPE, getFixedBody(), rbB)
	, m_frameInB(frameInB)
	, m_rotateOrder(rotOrder)
	, m_flags(0)
{
	///not providing rigidbody A means implicitly using worldspace for body A
	m_frameInA = rbB.getCenterOfMassTransform() * m_frameInB;
	calculateTransforms();
}